

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O1

int btbb_decode_header(btbb_packet *pkt)

{
  uint8_t host_order_1;
  int iVar1;
  long lVar2;
  byte bVar3;
  int i;
  uint16_t host_order;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int i_2;
  byte bVar7;
  int iVar8;
  bool bVar9;
  byte local_38 [8];
  char header [18];
  
  uVar5 = pkt->flags;
  iVar8 = 0;
  if ((uVar5 & 0x10) != 0) {
    iVar1 = unfec13(pkt->symbols + 0x44,(char *)local_38,0x12);
    iVar8 = 0;
    if (iVar1 != 0) {
      uVar4 = (uint)"cU\x112f:l-\\> vX\vP\x02%E7\b\x14(Jr\x0fj\x1eN5H\x1c\x1aD\a\'qiMG\x19T19,=u\n\x01{|\x16}o\x17*~\x06pL\x180+t"
                    [pkt->clock & 0x3f];
      lVar2 = 0;
      do {
        bVar6 = local_38[lVar2];
        if ((uVar5 & 1) != 0) {
          bVar6 = bVar6 ^ "\x01\x01\x01"[uVar4 % 0x7f];
        }
        pkt->packet_header[lVar2] = bVar6;
        uVar4 = uVar4 % 0x7f + 1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x12);
      lVar2 = 0;
      uVar5 = 0;
      do {
        bVar6 = (byte)lVar2 & 0x1f;
        uVar5 = uVar5 | (int)pkt->packet_header[lVar2] << bVar6;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 10);
      lVar2 = 0;
      uVar4 = 0 << bVar6;
      do {
        bVar6 = (byte)uVar4 | pkt->packet_header[lVar2 + 10] << ((byte)lVar2 & 0x1f);
        uVar4 = (uint)bVar6;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      uVar4 = 9;
      bVar3 = bVar6;
      do {
        bVar7 = bVar3 ^ 0x65;
        if (-1 < (char)bVar3) {
          bVar7 = bVar3;
        }
        bVar3 = (((uVar5 & 0xffff) >> (uVar4 & 0x1f) & 1) != 0 ^ bVar7 >> 7) + bVar7 * '\x02';
        bVar9 = uVar4 != 0;
        uVar4 = uVar4 - 1;
      } while (bVar9);
      bVar3 = bVar3 * '\x10' | bVar3 >> 4;
      bVar3 = bVar3 >> 2 & 0x33 | (bVar3 & 0x33) << 2;
      iVar8 = 0;
      if ((byte)(bVar3 >> 1 & 0x55 | (bVar3 & 0x55) * '\x02') == pkt->UAP) {
        lVar2 = 0;
        bVar3 = 0;
        do {
          bVar3 = bVar3 | pkt->packet_header[lVar2] << ((byte)lVar2 & 0x1f);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        pkt->packet_lt_addr = bVar3;
        lVar2 = 0;
        bVar3 = 0;
        do {
          bVar3 = bVar3 | pkt->packet_header[lVar2 + 3] << ((byte)lVar2 & 0x1f);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        pkt->packet_type = bVar3;
        lVar2 = 0;
        bVar3 = 0;
        do {
          bVar3 = bVar3 | pkt->packet_header[lVar2 + 7] << ((byte)lVar2 & 0x1f);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 3);
        pkt->packet_flags = bVar3;
        pkt->packet_hec = bVar6;
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

int btbb_decode_header(btbb_packet* pkt)
{
	/* skip 72 bit access code */
	char *stream = pkt->symbols + 68;
	/* 18 bit packet header */
	char header[18];
	uint8_t UAP;

	if (btbb_packet_get_flag(pkt, BTBB_CLK6_VALID) && unfec13(stream, header, 18)) {
		unwhiten(header, pkt->packet_header, pkt->clock, 18, 0, pkt);
		uint16_t hdr_data = air_to_host16(pkt->packet_header, 10);
		uint8_t hec = air_to_host8(&pkt->packet_header[10], 8);
		UAP = uap_from_hec(hdr_data, hec);
		if (UAP == pkt->UAP) {
			pkt->packet_lt_addr = air_to_host8(&pkt->packet_header[0], 3);
			pkt->packet_type = air_to_host8(&pkt->packet_header[3], 4);
			pkt->packet_flags = air_to_host8(&pkt->packet_header[7], 3);
			pkt->packet_hec = hec;
			return 1;
		}
	}
	
	return 0;
}